

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * mult(Bigint *a,Bigint *b)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Bigint *pBVar5;
  Bigint *pBVar6;
  uint32 *puVar7;
  uint32 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (((a->x[0] == 0) && (a->wds == 1)) || (b->wds == 1 && b->x[0] == 0)) {
    pBVar5 = Balloc(0);
    pBVar6 = (Bigint *)0x0;
    if (pBVar5 != (Bigint *)0x0) {
      pBVar5->wds = 1;
      pBVar5->x[0] = 0;
      pBVar6 = pBVar5;
    }
  }
  else {
    pBVar5 = a;
    if (a->wds < b->wds) {
      pBVar5 = b;
      b = a;
    }
    iVar2 = pBVar5->wds;
    iVar3 = b->wds;
    uVar14 = (long)iVar3 + (long)iVar2;
    uVar12 = (uint)uVar14;
    pBVar6 = Balloc((uint)(pBVar5->maxwds < (int)uVar12) + pBVar5->k);
    if (pBVar6 == (Bigint *)0x0) {
      pBVar6 = (Bigint *)0x0;
    }
    else {
      puVar7 = pBVar6->x;
      for (puVar8 = puVar7; puVar8 < pBVar6->x + uVar14; puVar8 = puVar8 + 1) {
        *puVar8 = 0;
      }
      for (puVar8 = b->x; puVar8 < b->x + iVar3; puVar8 = puVar8 + 1) {
        uVar4 = *puVar8;
        if ((ulong)uVar4 != 0) {
          lVar9 = 0;
          uVar10 = 0;
          do {
            puVar1 = (uint *)((long)pBVar5->x + lVar9);
            uVar11 = *(uint *)((long)puVar7 + lVar9) + uVar10 + (ulong)*puVar1 * (ulong)uVar4;
            uVar10 = uVar11 >> 0x20;
            *(int *)((long)puVar7 + lVar9) = (int)uVar11;
            lVar9 = lVar9 + 4;
          } while (puVar1 + 1 < pBVar5->x + iVar2);
          *(int *)((long)puVar7 + lVar9) = (int)(uVar11 >> 0x20);
        }
        puVar7 = puVar7 + 1;
      }
      for (puVar8 = pBVar6->x + (uVar14 - 1);
          (uVar13 = (uint)uVar14, uVar4 = (int)uVar12 >> 0x1f & uVar12, 0 < (int)uVar13 &&
          (uVar4 = uVar13, *puVar8 == 0)); puVar8 = puVar8 + -1) {
        uVar14 = (ulong)(uVar13 - 1);
      }
      pBVar6->wds = uVar4;
    }
  }
  return pBVar6;
}

Assistant:

static Bigint *
mult(Bigint *a, Bigint *b)
{
    Bigint *c;
    int k, wa, wb, wc;
    ULong *x, *xa, *xae, *xb, *xbe, *xc, *xc0;
    ULong y;
#ifdef ULLong
    ULLong carry, z;
#else
    ULong carry, z;
    ULong z2;
#endif

    if ((!a->x[0] && a->wds == 1) || (!b->x[0] && b->wds == 1)) {
        c = Balloc(0);
        if (c == NULL)
            return NULL;
        c->wds = 1;
        c->x[0] = 0;
        return c;
    }

    if (a->wds < b->wds) {
        c = a;
        a = b;
        b = c;
    }
    k = a->k;
    wa = a->wds;
    wb = b->wds;
    wc = wa + wb;
    if (wc > a->maxwds)
        k++;
    c = Balloc(k);
    if (c == NULL)
        return NULL;
    for(x = c->x, xa = x + wc; x < xa; x++)
        *x = 0;
    xa = a->x;
    xae = xa + wa;
    xb = b->x;
    xbe = xb + wb;
    xc0 = c->x;
#ifdef ULLong
    for(; xb < xbe; xc0++) {
        if ((y = *xb++)) {
            x = xa;
            xc = xc0;
            carry = 0;
            do {
                z = *x++ * (ULLong)y + *xc + carry;
                carry = z >> 32;
                *xc++ = (ULong)(z & FFFFFFFF);
            }
            while(x < xae);
            *xc = (ULong)carry;
        }
    }
#else
    for(; xb < xbe; xb++, xc0++) {
        if (y = *xb & 0xffff) {
            x = xa;
            xc = xc0;
            carry = 0;
            do {
                z = (*x & 0xffff) * y + (*xc & 0xffff) + carry;
                carry = z >> 16;
                z2 = (*x++ >> 16) * y + (*xc >> 16) + carry;
                carry = z2 >> 16;
                Storeinc(xc, z2, z);
            }
            while(x < xae);
            *xc = carry;
        }
        if (y = *xb >> 16) {
            x = xa;
            xc = xc0;
            carry = 0;
            z2 = *xc;
            do {
                z = (*x & 0xffff) * y + (*xc >> 16) + carry;
                carry = z >> 16;
                Storeinc(xc, z, z2);
                z2 = (*x++ >> 16) * y + (*xc & 0xffff) + carry;
                carry = z2 >> 16;
            }
            while(x < xae);
            *xc = z2;
        }
    }
#endif
    for(xc0 = c->x, xc = xc0 + wc; wc > 0 && !*--xc; --wc) ;
    c->wds = wc;
    return c;
}